

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void paintSep(QPainter *p,QWidget *w,QRect *r,Orientation o,bool mouse_over)

{
  bool bVar1;
  QPalette *pQVar2;
  QStyle *pQVar3;
  int in_ECX;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  QStyleOption *in_RDI;
  undefined1 in_R8B;
  undefined8 in_R9;
  long in_FS_OFFSET;
  QStyleOption opt;
  QWidget *in_stack_ffffffffffffff88;
  undefined3 in_stack_ffffffffffffff90;
  uint uVar4;
  undefined1 local_48 [8];
  QFlags<QStyle::StateFlag> local_40 [2];
  undefined8 local_38;
  undefined8 uStack_30;
  QPalette local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = CONCAT13(in_R8B,in_stack_ffffffffffffff90) & 0x1ffffff;
  memset(local_48,0xaa,0x40);
  QStyleOption::QStyleOption(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  QFlags<QStyle::StateFlag>::QFlags
            ((QFlags<QStyle::StateFlag> *)CONCAT44(in_ECX,uVar4),
             (StateFlag)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  bVar1 = QWidget::isEnabled((QWidget *)0x573a5e);
  if (bVar1) {
    QFlags<QStyle::StateFlag>::operator|=(local_40,State_Enabled);
  }
  if (in_ECX != 1) {
    QFlags<QStyle::StateFlag>::operator|=(local_40,State_Horizontal);
  }
  if ((uVar4 & 0x1000000) != 0) {
    QFlags<QStyle::StateFlag>::operator|=(local_40,State_MouseOver);
  }
  local_38 = *in_RDX;
  uStack_30 = in_RDX[1];
  pQVar2 = QWidget::palette((QWidget *)CONCAT44(in_ECX,uVar4));
  QPalette::operator=(&local_20,(QPalette *)pQVar2);
  pQVar3 = QWidget::style(in_stack_ffffffffffffff88);
  (**(code **)(*(long *)pQVar3 + 0xb0))(pQVar3,0x1b,local_48,in_RDI,in_RSI,in_R9,local_48);
  QStyleOption::~QStyleOption((QStyleOption *)CONCAT44(in_ECX,uVar4));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void paintSep(QPainter *p, QWidget *w, const QRect &r, Qt::Orientation o, bool mouse_over)
{
    QStyleOption opt(0);
    opt.state = QStyle::State_None;
    if (w->isEnabled())
        opt.state |= QStyle::State_Enabled;
    if (o != Qt::Horizontal)
        opt.state |= QStyle::State_Horizontal;
    if (mouse_over)
        opt.state |= QStyle::State_MouseOver;
    opt.rect = r;
    opt.palette = w->palette();

    w->style()->drawPrimitive(QStyle::PE_IndicatorDockWidgetResizeHandle, &opt, p, w);
}